

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O3

char * nowide::basic_convert<char,wchar_t>
                 (char *buffer,size_t buffer_size,wchar_t *source_begin,wchar_t *source_end)

{
  wchar_t value;
  char *out;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (buffer_size == 0) {
    buffer = (char *)0x0;
  }
  else {
    out = buffer;
    if (source_begin != source_end) {
      uVar2 = buffer_size - 1;
      do {
        value = *source_begin;
        if ((0x10ffff < (uint)value) || ((value & 0x1ff800U) == 0xd800)) {
LAB_00104ebc:
          buffer = (char *)0x0;
          break;
        }
        uVar1 = 1;
        if ((0x7f < (uint)value) && (uVar1 = 2, 0x7ff < (uint)value)) {
          uVar1 = 4 - (ulong)((uint)value < 0x10000);
        }
        bVar3 = uVar2 < uVar1;
        uVar2 = uVar2 - uVar1;
        if (bVar3) goto LAB_00104ebc;
        source_begin = source_begin + 1;
        out = utf::utf_traits<char,1>::encode<char*>(value,out);
      } while (source_begin != source_end);
    }
    *out = '\0';
  }
  return buffer;
}

Assistant:

CharOut *basic_convert(CharOut *buffer,size_t buffer_size,CharIn const *source_begin,CharIn const *source_end)
    {
        CharOut *rv = buffer;
        if(buffer_size == 0)
            return 0;
        buffer_size --;
        while(source_begin!=source_end) {
            using namespace nowide::utf;
            code_point c = utf_traits<CharIn>::template decode<CharIn const *>(source_begin,source_end);
            if(c==illegal || c==incomplete) {
                rv = 0;
                break;
            }
            size_t width = utf_traits<CharOut>::width(c);
            if(buffer_size < width) {
                rv=0;
                break;
            }
            buffer = utf_traits<CharOut>::template encode<CharOut *>(c,buffer);
            buffer_size -= width;
        }
        *buffer++ = 0;
        return rv;
    }